

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_impl_opengl2.cpp
# Opt level: O2

void ImGui_ImplOpenGL2_RenderDrawData(ImDrawData *draw_data)

{
  ImVec2 IVar1;
  ImVec2 IVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  ImDrawList *pIVar5;
  uint *puVar6;
  ImDrawVert *pIVar7;
  ImDrawCmd *pIVar8;
  code *pcVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined4 in_EAX;
  int iVar12;
  long lVar13;
  int cmd_i;
  long lVar14;
  long lVar15;
  int iVar16;
  float fVar17;
  float fVar18;
  int fb_width;
  int fb_height;
  GLint last_tex_env_mode;
  GLint last_shade_model;
  GLint last_texture;
  GLint last_polygon_mode [2];
  GLint last_scissor_box [4];
  GLint last_viewport [4];
  float local_58;
  float fStack_54;
  float local_48;
  float fStack_44;
  
  fb_width = (int)((draw_data->FramebufferScale).x * (draw_data->DisplaySize).x);
  fb_height = (int)((draw_data->FramebufferScale).y * (draw_data->DisplaySize).y);
  auVar10._4_4_ = -(uint)(fb_width == 0);
  auVar10._0_4_ = -(uint)(fb_width == 0);
  auVar10._8_4_ = -(uint)(fb_height == 0);
  auVar10._12_4_ = -(uint)(fb_height == 0);
  iVar12 = movmskpd(in_EAX,auVar10);
  if (iVar12 == 0) {
    (*glad_glGetIntegerv)(0x8069,&last_texture);
    (*glad_glGetIntegerv)(0xb40,last_polygon_mode);
    (*glad_glGetIntegerv)(0xba2,last_viewport);
    (*glad_glGetIntegerv)(0xc10,last_scissor_box);
    (*glad_glGetIntegerv)(0xb54,&last_shade_model);
    (*glad_glGetTexEnviv)(0x2300,0x2200,&last_tex_env_mode);
    (*glad_glPushAttrib)(0x7000);
    ImGui_ImplOpenGL2_SetupRenderState(draw_data,fb_width,fb_height);
    IVar1 = draw_data->DisplayPos;
    IVar2 = draw_data->FramebufferScale;
    for (lVar13 = 0; lVar13 < draw_data->CmdListsCount; lVar13 = lVar13 + 1) {
      pIVar5 = (draw_data->CmdLists).Data[lVar13];
      puVar6 = (pIVar5->IdxBuffer).Data;
      pIVar7 = (pIVar5->VtxBuffer).Data;
      (*glad_glVertexPointer)(2,0x1406,0x14,pIVar7);
      (*glad_glTexCoordPointer)(2,0x1406,0x14,&pIVar7->uv);
      (*glad_glColorPointer)(4,0x1401,0x14,&pIVar7->col);
      lVar15 = 0;
      for (lVar14 = 0; lVar14 < (pIVar5->CmdBuffer).Size; lVar14 = lVar14 + 1) {
        pIVar8 = (pIVar5->CmdBuffer).Data;
        pcVar9 = *(code **)((long)&pIVar8->UserCallback + lVar15);
        if (pcVar9 == (code *)0x0) {
          uVar3 = *(undefined8 *)((long)&(pIVar8->ClipRect).x + lVar15);
          uVar4 = *(undefined8 *)((long)&(pIVar8->ClipRect).z + lVar15);
          local_48 = IVar1.x;
          fStack_44 = IVar1.y;
          local_58 = IVar2.x;
          fStack_54 = IVar2.y;
          fVar17 = ((float)uVar3 - local_48) * local_58;
          fVar18 = ((float)((ulong)uVar3 >> 0x20) - fStack_44) * fStack_54;
          local_58 = ((float)uVar4 - local_48) * local_58;
          fStack_54 = ((float)((ulong)uVar4 >> 0x20) - fStack_44) * fStack_54;
          iVar12 = -(uint)(fVar17 < local_58);
          iVar16 = -(uint)(fVar18 < fStack_54);
          auVar11._4_4_ = iVar12;
          auVar11._0_4_ = iVar12;
          auVar11._8_4_ = iVar16;
          auVar11._12_4_ = iVar16;
          iVar12 = movmskpd(0,auVar11);
          if (iVar12 == 3) {
            (*glad_glScissor)((int)fVar17,(int)((float)fb_height - fStack_54),
                              (int)(local_58 - fVar17),(int)(fStack_54 - fVar18));
            (*glad_glBindTexture)(0xde1,*(GLuint *)((long)&pIVar8->TextureId + lVar15));
            (*glad_glDrawElements)
                      (4,*(GLsizei *)((long)&pIVar8->ElemCount + lVar15),0x1405,
                       puVar6 + *(uint *)((long)&pIVar8->IdxOffset + lVar15));
          }
        }
        else if (pcVar9 == (code *)0xfffffffffffffff8) {
          ImGui_ImplOpenGL2_SetupRenderState(draw_data,fb_width,fb_height);
        }
        else {
          (*pcVar9)(pIVar5,(long)&(pIVar8->ClipRect).x + lVar15);
        }
        lVar15 = lVar15 + 0x38;
      }
    }
    (*glad_glDisableClientState)(0x8076);
    (*glad_glDisableClientState)(0x8078);
    (*glad_glDisableClientState)(0x8074);
    (*glad_glBindTexture)(0xde1,last_texture);
    (*glad_glMatrixMode)(0x1700);
    (*glad_glPopMatrix)();
    (*glad_glMatrixMode)(0x1701);
    (*glad_glPopMatrix)();
    (*glad_glPopAttrib)();
    (*glad_glPolygonMode)(0x404,last_polygon_mode[0]);
    (*glad_glPolygonMode)(0x405,last_polygon_mode[1]);
    (*glad_glViewport)(last_viewport[0],last_viewport[1],last_viewport[2],last_viewport[3]);
    (*glad_glScissor)(last_scissor_box[0],last_scissor_box[1],last_scissor_box[2],
                      last_scissor_box[3]);
    (*glad_glShadeModel)(last_shade_model);
    (*glad_glTexEnvi)(0x2300,0x2200,last_tex_env_mode);
  }
  return;
}

Assistant:

void ImGui_ImplOpenGL2_RenderDrawData(ImDrawData* draw_data)
{
    // Avoid rendering when minimized, scale coordinates for retina displays (screen coordinates != framebuffer coordinates)
    int fb_width = (int)(draw_data->DisplaySize.x * draw_data->FramebufferScale.x);
    int fb_height = (int)(draw_data->DisplaySize.y * draw_data->FramebufferScale.y);
    if (fb_width == 0 || fb_height == 0)
        return;

    // Backup GL state
    GLint last_texture; glGetIntegerv(GL_TEXTURE_BINDING_2D, &last_texture);
    GLint last_polygon_mode[2]; glGetIntegerv(GL_POLYGON_MODE, last_polygon_mode);
    GLint last_viewport[4]; glGetIntegerv(GL_VIEWPORT, last_viewport);
    GLint last_scissor_box[4]; glGetIntegerv(GL_SCISSOR_BOX, last_scissor_box);
    GLint last_shade_model; glGetIntegerv(GL_SHADE_MODEL, &last_shade_model);
    GLint last_tex_env_mode; glGetTexEnviv(GL_TEXTURE_ENV, GL_TEXTURE_ENV_MODE, &last_tex_env_mode);
    glPushAttrib(GL_ENABLE_BIT | GL_COLOR_BUFFER_BIT | GL_TRANSFORM_BIT);

    // Setup desired GL state
    ImGui_ImplOpenGL2_SetupRenderState(draw_data, fb_width, fb_height);

    // Will project scissor/clipping rectangles into framebuffer space
    ImVec2 clip_off = draw_data->DisplayPos;         // (0,0) unless using multi-viewports
    ImVec2 clip_scale = draw_data->FramebufferScale; // (1,1) unless using retina display which are often (2,2)

    // Render command lists
    for (int n = 0; n < draw_data->CmdListsCount; n++)
    {
        const ImDrawList* cmd_list = draw_data->CmdLists[n];
        const ImDrawVert* vtx_buffer = cmd_list->VtxBuffer.Data;
        const ImDrawIdx* idx_buffer = cmd_list->IdxBuffer.Data;
        glVertexPointer(2, GL_FLOAT, sizeof(ImDrawVert), (const GLvoid*)((const char*)vtx_buffer + offsetof(ImDrawVert, pos)));
        glTexCoordPointer(2, GL_FLOAT, sizeof(ImDrawVert), (const GLvoid*)((const char*)vtx_buffer + offsetof(ImDrawVert, uv)));
        glColorPointer(4, GL_UNSIGNED_BYTE, sizeof(ImDrawVert), (const GLvoid*)((const char*)vtx_buffer + offsetof(ImDrawVert, col)));

        for (int cmd_i = 0; cmd_i < cmd_list->CmdBuffer.Size; cmd_i++)
        {
            const ImDrawCmd* pcmd = &cmd_list->CmdBuffer[cmd_i];
            if (pcmd->UserCallback)
            {
                // User callback, registered via ImDrawList::AddCallback()
                // (ImDrawCallback_ResetRenderState is a special callback value used by the user to request the renderer to reset render state.)
                if (pcmd->UserCallback == ImDrawCallback_ResetRenderState)
                    ImGui_ImplOpenGL2_SetupRenderState(draw_data, fb_width, fb_height);
                else
                    pcmd->UserCallback(cmd_list, pcmd);
            }
            else
            {
                // Project scissor/clipping rectangles into framebuffer space
                ImVec2 clip_min((pcmd->ClipRect.x - clip_off.x) * clip_scale.x, (pcmd->ClipRect.y - clip_off.y) * clip_scale.y);
                ImVec2 clip_max((pcmd->ClipRect.z - clip_off.x) * clip_scale.x, (pcmd->ClipRect.w - clip_off.y) * clip_scale.y);
                if (clip_max.x <= clip_min.x || clip_max.y <= clip_min.y)
                    continue;

                // Apply scissor/clipping rectangle (Y is inverted in OpenGL)
                glScissor((int)clip_min.x, (int)((float)fb_height - clip_max.y), (int)(clip_max.x - clip_min.x), (int)(clip_max.y - clip_min.y));

                // Bind texture, Draw
                glBindTexture(GL_TEXTURE_2D, (GLuint)(intptr_t)pcmd->GetTexID());
                glDrawElements(GL_TRIANGLES, (GLsizei)pcmd->ElemCount, sizeof(ImDrawIdx) == 2 ? GL_UNSIGNED_SHORT : GL_UNSIGNED_INT, idx_buffer + pcmd->IdxOffset);
            }
        }
    }

    // Restore modified GL state
    glDisableClientState(GL_COLOR_ARRAY);
    glDisableClientState(GL_TEXTURE_COORD_ARRAY);
    glDisableClientState(GL_VERTEX_ARRAY);
    glBindTexture(GL_TEXTURE_2D, (GLuint)last_texture);
    glMatrixMode(GL_MODELVIEW);
    glPopMatrix();
    glMatrixMode(GL_PROJECTION);
    glPopMatrix();
    glPopAttrib();
    glPolygonMode(GL_FRONT, (GLenum)last_polygon_mode[0]); glPolygonMode(GL_BACK, (GLenum)last_polygon_mode[1]);
    glViewport(last_viewport[0], last_viewport[1], (GLsizei)last_viewport[2], (GLsizei)last_viewport[3]);
    glScissor(last_scissor_box[0], last_scissor_box[1], (GLsizei)last_scissor_box[2], (GLsizei)last_scissor_box[3]);
    glShadeModel(last_shade_model);
    glTexEnvi(GL_TEXTURE_ENV, GL_TEXTURE_ENV_MODE, last_tex_env_mode);
}